

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool re2::IsValidUTF8(StringPiece *s,RegexpStatus *status)

{
  int iVar1;
  Rune local_34;
  undefined1 auStack_30 [4];
  Rune r;
  StringPiece t;
  RegexpStatus *status_local;
  StringPiece *s_local;
  
  _auStack_30 = s->ptr_;
  t.ptr_ = *(char **)&s->length_;
  t._8_8_ = status;
  do {
    iVar1 = StringPiece::size((StringPiece *)auStack_30);
    if (iVar1 < 1) {
      return true;
    }
    iVar1 = StringPieceToRune(&local_34,(StringPiece *)auStack_30,(RegexpStatus *)t._8_8_);
  } while (-1 < iVar1);
  return false;
}

Assistant:

static bool IsValidUTF8(const StringPiece& s, RegexpStatus* status) {
  StringPiece t = s;
  Rune r;
  while (t.size() > 0) {
    if (StringPieceToRune(&r, &t, status) < 0)
      return false;
  }
  return true;
}